

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void absl::base_internal::LLA_SkiplistDelete(AllocList *head,AllocList *e,AllocList **prev)

{
  uint uVar1;
  int iVar2;
  AllocList *pAVar3;
  int i;
  ulong uVar4;
  
  pAVar3 = LLA_SkiplistSearch(head,e,prev);
  if (pAVar3 != e) {
    raw_logging_internal::RawLog
              (kFatal,"low_level_alloc.cc",0xbc,"Check %s failed: %s","e == found",
               "element not in freelist");
  }
  uVar1 = e->levels;
  for (uVar4 = 0; (uVar1 != uVar4 && (prev[uVar4]->next[uVar4] == e)); uVar4 = uVar4 + 1) {
    prev[uVar4]->next[uVar4] = e->next[uVar4];
  }
  iVar2 = head->levels;
  while ((0 < iVar2 && (head->next[iVar2 - 1] == (AllocList *)0x0))) {
    iVar2 = iVar2 + -1;
    head->levels = iVar2;
  }
  return;
}

Assistant:

static void LLA_SkiplistDelete(AllocList *head, AllocList *e,
                               AllocList **prev) {
  AllocList *found = LLA_SkiplistSearch(head, e, prev);
  ABSL_RAW_CHECK(e == found, "element not in freelist");
  for (int i = 0; i != e->levels && prev[i]->next[i] == e; i++) {
    prev[i]->next[i] = e->next[i];
  }
  while (head->levels > 0 && head->next[head->levels - 1] == nullptr) {
    head->levels--;   // reduce head->levels if level unused
  }
}